

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  HSQUIRRELVM vm_00;
  int iVar2;
  bool bVar3;
  Foo foo;
  Klass<Foo,_void> k;
  Klass<Foo2,_Foo> k_1;
  VMStd vm;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  Foo local_cc;
  Klass<Foo,_void> local_c8;
  string local_b0;
  VM local_90;
  HSQOBJECT local_38;
  
  squall::VMStd::VMStd((VMStd *)&local_90,0x400);
  squall::VMStd::dofile((VMStd *)&local_90,"klass.nut");
  local_f8._M_unused._M_object = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Foo","");
  squall::Klass<Foo,_void>::Klass(&local_c8,&local_90,(string *)&local_f8);
  if ((code **)local_f8._M_unused._0_8_ != &local_e8) {
    operator_delete(local_f8._M_unused._M_object);
  }
  squall::Klass<Foo,void>::func<void(Foo::*)()>((Klass<Foo,void> *)&local_c8,"bar",0x106c2a);
  squall::Klass<Foo,void>::func<int(Foo::*)(std::__cxx11::string_const&)>
            ((Klass<Foo,void> *)&local_c8,"baz",0x106d02);
  local_cc.n_ = 0;
  local_f8._M_unused._M_object = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"zot","");
  squall::TableBase::call<void,Foo*>
            ((TableBase *)
             local_90.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,(string *)&local_f8,
             &local_cc);
  if ((code **)local_f8._M_unused._0_8_ != &local_e8) {
    operator_delete(local_f8._M_unused._M_object);
  }
  local_b0.field_2._M_allocated_capacity._0_4_ = 0x787571;
  local_b0._M_string_length = 3;
  vm_00 = *(HSQUIRRELVM *)CONCAT44(local_c8.vm_._4_4_,local_c8.vm_._0_4_);
  iVar2 = (local_c8.imp_.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count;
  do {
    LOCK();
    iVar1 = (local_c8.imp_.
             super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count;
    bVar3 = iVar2 == iVar1;
    if (bVar3) {
      (local_c8.imp_.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = iVar2 + 1;
      iVar1 = iVar2;
    }
    iVar2 = iVar1;
    UNLOCK();
  } while (!bVar3);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_38._type =
       (*((local_c8.imp_.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->super_KlassImpBase)._vptr_KlassImpBase[3])();
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(Foo_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/KatuH[P]squall/samples/klass.cpp:40:27)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(Foo_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/KatuH[P]squall/samples/klass.cpp:40:27)>
             ::_M_manager;
  squall::detail::defun_local<void,Foo*,std::__cxx11::string_const&>
            (vm_00,&local_38,&local_b0,
             (function<void_(Foo_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_c8.imp_.
             super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_f8._M_unused._M_object = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"quux","");
  squall::TableBase::call<void,Foo*>
            ((TableBase *)
             local_90.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,(string *)&local_f8,
             &local_cc);
  if ((code **)local_f8._M_unused._0_8_ != &local_e8) {
    operator_delete(local_f8._M_unused._M_object);
  }
  squall::Klass<Foo,_void>::~Klass(&local_c8);
  local_f8._M_unused._M_object = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Foo2","");
  squall::Klass<Foo2,_Foo>::Klass((Klass<Foo2,_Foo> *)&local_b0,&local_90,(string *)&local_f8);
  if ((code **)local_f8._M_unused._0_8_ != &local_e8) {
    operator_delete(local_f8._M_unused._M_object);
  }
  squall::Klass<Foo2,Foo>::func<void(Foo2::*)()>((Klass<Foo2,Foo> *)&local_b0,"bar2",0x106eea);
  local_c8.vm_._0_4_ = 0;
  local_f8._M_unused._M_object = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"zot2","");
  squall::TableBase::call<void,Foo2*>
            ((TableBase *)
             local_90.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,(string *)&local_f8,
             (Foo2 *)&local_c8);
  if ((code **)local_f8._M_unused._0_8_ != &local_e8) {
    operator_delete(local_f8._M_unused._M_object);
  }
  squall::Klass<Foo2,_Foo>::~Klass((Klass<Foo2,_Foo> *)&local_b0);
  squall::VM::~VM(&local_90);
  return 0;
}

Assistant:

int main() {
    try {
        squall::VMStd vm;
        vm.dofile("klass.nut");

        {
            squall::Klass<Foo> k(vm, "Foo");
            k.func("bar", &Foo::bar);
            k.func("baz", &Foo::baz);

            Foo foo;
            vm.call<void>("zot", &foo);

            k.func("qux", [](Foo* x, const std::string& y) {
                    std::cerr << "**** qux called: " << y << std::endl;
                    x->baz(y);
                });
            vm.call<void>("quux", &foo);
        }

        {
            squall::Klass<Foo2, Foo> k(vm, "Foo2");
            k.func("bar2", &Foo2::bar2);

            Foo2 foo2;
            vm.call<void>("zot2", &foo2);
        }
    }
    catch(squall::squirrel_error& e) {
        std::cerr << e.what() << std::endl;
    }

    return 0;
}